

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)>
               (interval_t *adata,date_t *bdata,date_t *cdata,date_t *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_date_t_interval_t_date_t_date_t_ValidityMask_ptr_unsigned_long *fun)

{
  interval_t a;
  interval_t a_00;
  bool bVar1;
  date_t dVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  undefined8 *puVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  SelectionVector *in_R9;
  SelectionVector *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  TemplatedValidityMask<unsigned_long> *in_stack_00000018;
  TemplatedValidityMask<unsigned_long> *in_stack_00000020;
  idx_t cidx_1;
  idx_t bidx_1;
  idx_t aidx_1;
  idx_t i_1;
  idx_t cidx;
  idx_t bidx;
  idx_t aidx;
  idx_t i;
  ulong in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff58;
  _func_date_t_interval_t_date_t_date_t_ValidityMask_ptr_unsigned_long *in_stack_ffffffffffffff60;
  date_t in_stack_ffffffffffffff68;
  date_t in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  ulong local_78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ulong local_38;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000018);
  if (((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000020), bVar1)
      ) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                              ((TemplatedValidityMask<unsigned_long> *)cidx_1), bVar1)) {
    for (local_78 = 0; local_78 < in_R8; local_78 = local_78 + 1) {
      iVar3 = SelectionVector::get_index(in_R9,local_78);
      iVar4 = SelectionVector::get_index(in_stack_00000008,local_78);
      iVar5 = SelectionVector::get_index(in_stack_00000010,local_78);
      puVar6 = (undefined8 *)(in_RDI + iVar3 * 0x10);
      a_00.micros = iVar4;
      a_00.months = (int)iVar5;
      a_00.days = (int)(iVar5 >> 0x20);
      in_stack_ffffffffffffff6c =
           TernaryLambdaWrapperWithNulls::
           Operation<duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long),duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                     ((_func_date_t_interval_t_date_t_date_t_ValidityMask_ptr_unsigned_long *)
                      puVar6[1],a_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                      (ValidityMask *)*puVar6,
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      *(int32_t *)(in_RCX + local_78 * 4) = in_stack_ffffffffffffff6c.days;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_R8; local_38 = local_38 + 1) {
      SelectionVector::get_index(in_R9,local_38);
      iVar3 = SelectionVector::get_index(in_stack_00000008,local_38);
      iVar4 = SelectionVector::get_index(in_stack_00000010,local_38);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff58,
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (((bVar1) &&
          (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (in_stack_ffffffffffffff58,
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)), bVar1)
          ) && (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                  (in_stack_ffffffffffffff58,
                                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)),
               bVar1)) {
        a.micros = in_stack_ffffffffffffff78;
        a.months = (int)in_stack_ffffffffffffff70;
        a.days = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        in_stack_ffffffffffffff48 = local_38;
        dVar2 = TernaryLambdaWrapperWithNulls::
                Operation<duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long),duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                          (in_stack_ffffffffffffff60,a,in_stack_ffffffffffffff6c,
                           in_stack_ffffffffffffff68,(ValidityMask *)in_stack_ffffffffffffff58,
                           CONCAT44(*(undefined4 *)(in_RSI + iVar3 * 4),
                                    *(undefined4 *)(in_RDX + iVar4 * 4)));
        *(int32_t *)(in_RCX + local_38 * 4) = dVar2.days;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}